

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::jacobiEigenSolver<double>
               (Matrix33<double> *A,Vec3<double> *S,Matrix33<double> *V,double tol)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double *pdVar4;
  Vec3<double> *in_RSI;
  Matrix33<double> *in_RDI;
  double in_XMM0_Qa;
  BaseType_conflict BVar5;
  int i_1;
  bool changed;
  Vec3<double> Z;
  int numIter;
  double absTol;
  int maxIter;
  int i;
  bool local_81;
  Matrix33<double> *in_stack_ffffffffffffff80;
  double dVar6;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar8;
  undefined1 uVar9;
  int local_58;
  Vec3<double> local_50;
  int local_34;
  double local_30;
  undefined4 local_28;
  int local_24;
  double local_20;
  Vec3<double> *local_10;
  Matrix33<double> *local_8;
  
  local_20 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Matrix33<double>::makeIdentity(in_stack_ffffffffffffff80);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    pdVar4 = Matrix33<double>::operator[](local_8,local_24);
    dVar6 = pdVar4[local_24];
    pdVar4 = Vec3<double>::operator[](local_10,local_24);
    *pdVar4 = dVar6;
  }
  local_28 = 0x14;
  BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_2_5::Matrix33<double>>
                    ((Matrix33<double> *)
                     CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  local_30 = local_20 * BVar5;
  if ((local_30 != 0.0) || (NAN(local_30))) {
    local_34 = 0;
    do {
      Vec3<double>::Vec3(&local_50,0.0,0.0,0.0);
      local_34 = local_34 + 1;
      bVar2 = (anonymous_namespace)::jacobiRotation<0,1,2,double>
                        ((Matrix33<double> *)Z.z,(Matrix33<double> *)Z.y,(Vec3<double> *)Z.x,_i_1);
      bVar3 = (anonymous_namespace)::jacobiRotation<0,2,1,double>
                        ((Matrix33<double> *)Z.z,(Matrix33<double> *)Z.y,(Vec3<double> *)Z.x,_i_1);
      bVar8 = true;
      if (!bVar3) {
        bVar8 = bVar2;
      }
      uVar9 = bVar8;
      bVar3 = (anonymous_namespace)::jacobiRotation<1,2,0,double>
                        ((Matrix33<double> *)Z.z,(Matrix33<double> *)Z.y,(Vec3<double> *)Z.x,_i_1);
      bVar2 = true;
      if (!bVar3) {
        bVar2 = bVar8;
      }
      uVar7 = bVar2;
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        pdVar4 = Vec3<double>::operator[](&local_50,local_58);
        dVar6 = *pdVar4;
        pdVar4 = Vec3<double>::operator[](local_10,local_58);
        dVar1 = *pdVar4;
        *pdVar4 = dVar6 + dVar1;
        pdVar4 = Matrix33<double>::operator[](local_8,local_58);
        pdVar4[local_58] = dVar6 + dVar1;
      }
      if (bVar2 == false) {
        return;
      }
      BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_2_5::Matrix33<double>>
                        ((Matrix33<double> *)
                         CONCAT17(uVar9,CONCAT16(uVar7,in_stack_ffffffffffffff90)));
      local_81 = local_30 < BVar5 && local_34 < 0x14;
    } while (local_81);
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A,
                   Vec3<T>& S,
                   Matrix33<T>& V,
                   const T tol)
{
    V.makeIdentity();
    for(int i = 0; i < 3; ++i) {
        S[i] = A[i][i];
    }

    const int maxIter = 20;  // In case we get really unlucky, prevents infinite loops
    const T absTol = tol * maxOffDiagSymm (A);  // Tolerance is in terms of the maximum
    if (absTol != 0)                        // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to 
            // the corresponding diagonal entry of A and 
            // this will increase numerical errors
            Vec3<T> Z(0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for(int i = 0; i < 3; ++i) {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed)
                break;
        } while (maxOffDiagSymm(A) > absTol && numIter < maxIter);
    }
}